

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O2

bool tcu::isLookupResultValid
               (TextureCubeView *texture,Sampler *sampler,LookupPrecision *prec,Vec3 *coord,
               Vec2 *lodBounds,Vec4 *result)

{
  CubeFace CVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  uint uVar5;
  FilterMode FVar6;
  int iVar7;
  long lVar8;
  int levelNdx;
  int iVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 local_288 [12];
  int numPossibleFaces;
  undefined8 local_278;
  undefined8 uStack_270;
  Vec3 *local_268;
  Vec2 *local_260;
  long local_258;
  Vec2 local_250;
  undefined1 local_248 [16];
  CubeFace possibleFaces [6];
  ConstPixelBufferAccess faces [6];
  ConstPixelBufferAccess faces1 [6];
  
  numPossibleFaces = 0;
  local_268 = coord;
  local_260 = lodBounds;
  TexVerifierUtil::getPossibleCubeFaces(coord,&prec->coordBits,possibleFaces,&numPossibleFaces);
  bVar3 = true;
  if (numPossibleFaces != 0) {
    for (local_258 = 0; local_258 < numPossibleFaces; local_258 = local_258 + 1) {
      CVar1 = possibleFaces[local_258];
      projectToFace((CubeFace)faces,(Vec3 *)(ulong)CVar1);
      local_288._4_4_ = faces[0].m_format.order;
      local_288._8_4_ = faces[0].m_format.type;
      local_278 = *(undefined8 *)local_260->m_data;
      fVar10 = sampler->lodThreshold;
      uStack_270 = 0;
      local_288._0_4_ = CVar1;
      if ((float)local_278 <= fVar10) {
        lVar8 = 0;
        do {
          ConstPixelBufferAccess::ConstPixelBufferAccess
                    ((ConstPixelBufferAccess *)((long)faces[0].m_size.m_data + lVar8 + -8));
          lVar8 = lVar8 + 0x28;
        } while (lVar8 != 0xf0);
        getCubeLevelFaces(texture,0,&faces);
        bVar3 = isCubeLevelSampleResultValid
                          (&faces,sampler,sampler->magFilter,prec,(CubeFaceFloatCoords *)local_288,
                           result);
        if (bVar3) {
          return true;
        }
      }
      fVar11 = local_278._4_4_;
      if (fVar10 < local_278._4_4_) {
        FVar6 = sampler->minFilter;
        iVar7 = texture->m_numLevels;
        iVar9 = iVar7 + -1;
        if (iVar9 < 1 || (FVar6 - NEAREST_MIPMAP_LINEAR & 0xfffffffd) != 0) {
          if ((FVar6 == LINEAR_MIPMAP_NEAREST) || (FVar6 == NEAREST_MIPMAP_NEAREST)) {
            fVar10 = ceilf((float)local_278 + 0.5);
            iVar4 = (int)fVar10 + -1;
            iVar7 = iVar9;
            if (iVar4 < iVar9) {
              iVar7 = iVar4;
            }
            if (iVar4 < 0) {
              iVar7 = 0;
            }
            fVar10 = floorf(fVar11 + 0.5);
            iVar4 = (int)fVar10;
            if (iVar4 < iVar9) {
              iVar9 = iVar4;
            }
            if (iVar4 < 0) {
              iVar9 = 0;
            }
            while (iVar7 <= iVar9) {
              lVar8 = 0;
              do {
                ConstPixelBufferAccess::ConstPixelBufferAccess
                          ((ConstPixelBufferAccess *)((long)faces[0].m_size.m_data + lVar8 + -8));
                lVar8 = lVar8 + 0x28;
              } while (lVar8 != 0xf0);
              getCubeLevelFaces(texture,iVar7,&faces);
              uVar5 = sampler->minFilter - LINEAR;
              FVar6 = NEAREST;
              if (uVar5 < 5) {
                FVar6 = *(FilterMode *)(&DAT_0191af60 + (ulong)uVar5 * 4);
              }
              bVar3 = isCubeLevelSampleResultValid
                                (&faces,sampler,FVar6,prec,(CubeFaceFloatCoords *)local_288,result);
              iVar7 = iVar7 + 1;
              if (bVar3) {
                return true;
              }
            }
          }
          else {
            lVar8 = 0;
            do {
              ConstPixelBufferAccess::ConstPixelBufferAccess
                        ((ConstPixelBufferAccess *)((long)faces[0].m_size.m_data + lVar8 + -8));
              lVar8 = lVar8 + 0x28;
            } while (lVar8 != 0xf0);
            getCubeLevelFaces(texture,0,&faces);
            bVar3 = isCubeLevelSampleResultValid
                              (&faces,sampler,sampler->minFilter,prec,
                               (CubeFaceFloatCoords *)local_288,result);
            if (bVar3) {
              return true;
            }
          }
        }
        else {
          fVar10 = floorf((float)local_278);
          iVar4 = (int)fVar10;
          iVar7 = iVar7 + -2;
          iVar9 = iVar7;
          if (iVar4 < iVar7) {
            iVar9 = iVar4;
          }
          if (iVar4 < 0) {
            iVar9 = 0;
          }
          fVar10 = floorf(fVar11);
          iVar4 = (int)fVar10;
          if (iVar4 < iVar7) {
            iVar7 = iVar4;
          }
          if (iVar4 < 0) {
            iVar7 = 0;
          }
          while (iVar9 <= iVar7) {
            fVar10 = (float)iVar9;
            fVar11 = (float)local_278 - fVar10;
            fVar12 = local_278._4_4_ - fVar10;
            auVar2._4_4_ = fVar12;
            auVar2._0_4_ = fVar11;
            auVar2._8_4_ = (float)uStack_270 - fVar10;
            auVar2._12_4_ = uStack_270._4_4_ - fVar10;
            local_248 = minps(_DAT_0166f150,auVar2);
            lVar8 = 0;
            do {
              ConstPixelBufferAccess::ConstPixelBufferAccess
                        ((ConstPixelBufferAccess *)((long)faces[0].m_size.m_data + lVar8 + -8));
              lVar8 = lVar8 + 0x28;
            } while (lVar8 != 0xf0);
            lVar8 = 0;
            do {
              ConstPixelBufferAccess::ConstPixelBufferAccess
                        ((ConstPixelBufferAccess *)((long)faces1[0].m_size.m_data + lVar8 + -8));
              lVar8 = lVar8 + 0x28;
            } while (lVar8 != 0xf0);
            getCubeLevelFaces(texture,iVar9,&faces);
            iVar9 = iVar9 + 1;
            getCubeLevelFaces(texture,iVar9,&faces1);
            uVar5 = sampler->minFilter - LINEAR;
            FVar6 = NEAREST;
            if (uVar5 < 5) {
              FVar6 = *(FilterMode *)(&DAT_0191af60 + (ulong)uVar5 * 4);
            }
            local_250.m_data[0] = (float)(-(uint)(0.0 <= fVar11) & local_248._0_4_);
            local_250.m_data[1] = (float)(-(uint)(0.0 <= fVar12) & local_248._4_4_);
            bVar3 = isCubeMipmapLinearSampleResultValid
                              (&faces,&faces1,sampler,FVar6,prec,(CubeFaceFloatCoords *)local_288,
                               &local_250,result);
            if (bVar3) {
              return true;
            }
          }
        }
      }
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool isLookupResultValid (const TextureCubeView& texture, const Sampler& sampler, const LookupPrecision& prec, const Vec3& coord, const Vec2& lodBounds, const Vec4& result)
{
	int			numPossibleFaces				= 0;
	CubeFace	possibleFaces[CUBEFACE_LAST];

	DE_ASSERT(isSamplerSupported(sampler));

	getPossibleCubeFaces(coord, prec.coordBits, &possibleFaces[0], numPossibleFaces);

	if (numPossibleFaces == 0)
		return true; // Result is undefined.

	for (int tryFaceNdx = 0; tryFaceNdx < numPossibleFaces; tryFaceNdx++)
	{
		const CubeFaceFloatCoords	faceCoords		(possibleFaces[tryFaceNdx], projectToFace(possibleFaces[tryFaceNdx], coord));
		const float					minLod			= lodBounds.x();
		const float					maxLod			= lodBounds.y();
		const bool					canBeMagnified	= minLod <= sampler.lodThreshold;
		const bool					canBeMinified	= maxLod > sampler.lodThreshold;

		if (canBeMagnified)
		{
			ConstPixelBufferAccess faces[CUBEFACE_LAST];
			getCubeLevelFaces(texture, 0, faces);

			if (isCubeLevelSampleResultValid(faces, sampler, sampler.magFilter, prec, faceCoords, result))
				return true;
		}

		if (canBeMinified)
		{
			const bool	isNearestMipmap	= isNearestMipmapFilter(sampler.minFilter);
			const bool	isLinearMipmap	= isLinearMipmapFilter(sampler.minFilter);
			const int	minTexLevel		= 0;
			const int	maxTexLevel		= texture.getNumLevels()-1;

			DE_ASSERT(minTexLevel <= maxTexLevel);

			if (isLinearMipmap && minTexLevel < maxTexLevel)
			{
				const int	minLevel	= de::clamp((int)deFloatFloor(minLod), minTexLevel, maxTexLevel-1);
				const int	maxLevel	= de::clamp((int)deFloatFloor(maxLod), minTexLevel, maxTexLevel-1);

				DE_ASSERT(minLevel <= maxLevel);

				for (int levelNdx = minLevel; levelNdx <= maxLevel; levelNdx++)
				{
					const float				minF	= de::clamp(minLod - float(levelNdx), 0.0f, 1.0f);
					const float				maxF	= de::clamp(maxLod - float(levelNdx), 0.0f, 1.0f);

					ConstPixelBufferAccess	faces0[CUBEFACE_LAST];
					ConstPixelBufferAccess	faces1[CUBEFACE_LAST];

					getCubeLevelFaces(texture, levelNdx,		faces0);
					getCubeLevelFaces(texture, levelNdx + 1,	faces1);

					if (isCubeMipmapLinearSampleResultValid(faces0, faces1, sampler, getLevelFilter(sampler.minFilter), prec, faceCoords, Vec2(minF, maxF), result))
						return true;
				}
			}
			else if (isNearestMipmap)
			{
				// \note The accurate formula for nearest mipmapping is level = ceil(lod + 0.5) - 1 but Khronos has made
				//		 decision to allow floor(lod + 0.5) as well.
				const int	minLevel	= de::clamp((int)deFloatCeil(minLod + 0.5f) - 1,	minTexLevel, maxTexLevel);
				const int	maxLevel	= de::clamp((int)deFloatFloor(maxLod + 0.5f),		minTexLevel, maxTexLevel);

				DE_ASSERT(minLevel <= maxLevel);

				for (int levelNdx = minLevel; levelNdx <= maxLevel; levelNdx++)
				{
					ConstPixelBufferAccess faces[CUBEFACE_LAST];
					getCubeLevelFaces(texture, levelNdx, faces);

					if (isCubeLevelSampleResultValid(faces, sampler, getLevelFilter(sampler.minFilter), prec, faceCoords, result))
						return true;
				}
			}
			else
			{
				ConstPixelBufferAccess faces[CUBEFACE_LAST];
				getCubeLevelFaces(texture, 0, faces);

				if (isCubeLevelSampleResultValid(faces, sampler, sampler.minFilter, prec, faceCoords, result))
					return true;
			}
		}
	}

	return false;
}